

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O3

Vector * __thiscall Box::find_normal(Vector *__return_storage_ptr__,Box *this,Vector *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  Vector *normal;
  long lVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar1 = p->x;
  dVar2 = p->y;
  dVar3 = p->z;
  lVar4 = 0;
  dVar8 = INFINITY;
  lVar5 = -9;
  iVar6 = 0;
  do {
    dVar9 = this->d1[lVar5 + 2] * dVar3 + this->d1[lVar5] * dVar1 + this->d1[lVar5 + 1] * dVar2;
    dVar11 = ABS(this->d1[lVar4] + dVar9);
    dVar10 = ABS(dVar9 + this->d2[lVar4]);
    dVar9 = dVar11;
    if (dVar8 <= dVar11) {
      dVar9 = dVar8;
    }
    iVar7 = (int)lVar4;
    if (dVar9 <= dVar10) {
      iVar7 = iVar6;
    }
    iVar6 = (int)lVar4;
    if (dVar8 <= dVar11) {
      iVar6 = iVar7;
    }
    dVar8 = dVar10;
    if (dVar9 <= dVar10) {
      dVar8 = dVar9;
    }
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 3;
  } while (lVar5 != 0);
  dVar9 = this->n[iVar6].x;
  dVar10 = this->n[iVar6].y;
  __return_storage_ptr__->x = dVar9;
  __return_storage_ptr__->y = dVar10;
  dVar8 = this->n[iVar6].z;
  __return_storage_ptr__->z = dVar8;
  if ((dVar3 - (this->center).z) * dVar8 +
      (dVar1 - (this->center).x) * dVar9 + dVar10 * (dVar2 - (this->center).y) < 0.0) {
    __return_storage_ptr__->x = -dVar9;
    __return_storage_ptr__->y = -dVar10;
    __return_storage_ptr__->z = -dVar8;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector Box::find_normal( Vector& p )
{
    double MinDist = INFINITY;
    int index = 0;
    double d,Dist1,Dist2;
    Vector normal;
    int i;

    for( i = 0; i < 3; i++ )
    {
        d = p & n[i];
        Dist1 = fabs(d + d1[i]);
        Dist2 = fabs(d + d2[i]);

        if( Dist1 < MinDist )
        {
            MinDist = Dist1;
            index = i;
        }
        if( Dist2 < MinDist )
        {
            MinDist = Dist2;
            index = i;
        }
    }
    normal = n[index];
    if( ((p - center) & normal) < 0.0 )
        normal = -normal;

    return normal;
}